

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseArray.h
# Opt level: O3

float * __thiscall SparseArray<float,_512UL>::operator[](SparseArray<float,_512UL> *this,HaU32 key)

{
  float *pfVar1;
  float dummy;
  float local_14;
  
  pfVar1 = find(this,key);
  if (pfVar1 == (float *)0x0) {
    insert(this,key,&local_14);
    pfVar1 = find(this,key);
    if (pfVar1 == (float *)0x0) {
      __assert_fail("v",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/SparseArray.h"
                    ,0x46,
                    "Value &SparseArray<float>::operator[](HaU32) [Value = float, hashTableSize = 512]"
                   );
    }
  }
  return pfVar1;
}

Assistant:

Value& operator[] (HaU32 key)
	{
		Value *v = find(key);
		if ( v == NULL )
		{
			Value dummy;
			insert(key,dummy);
			v = find(key);
			HACD_ASSERT(v);
		}
		return *v;
	}